

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  long lVar1;
  Status SVar2;
  _Alloc_hider _Var3;
  long lVar4;
  undefined8 *puVar5;
  long *in_R8;
  char *__tmp;
  long in_FS_OFFSET;
  Status local_a8;
  Table *table;
  RandomAccessFile *file;
  Slice key;
  string old_fname;
  string fname;
  char buf [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->env_ = (Env *)0x0;
  EncodeFixed64(buf,file_size);
  key.size_ = 8;
  key.data_ = buf;
  lVar4 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))();
  *in_R8 = lVar4;
  if (lVar4 != 0) goto LAB_0054b064;
  TableFileName(&fname,(string *)(file_number + 8),file_size);
  file = (RandomAccessFile *)0x0;
  table = (Table *)0x0;
  (**(code **)(**(long **)file_number + 0x18))(&old_fname,*(long **)file_number,&fname);
  _Var3 = old_fname._M_dataplus;
  this->env_ = (Env *)old_fname._M_dataplus._M_p;
  old_fname._M_dataplus._M_p = (pointer)0x0;
  Status::~Status((Status *)&old_fname);
  if (_Var3._M_p == (pointer)0x0) {
LAB_0054afcd:
    Table::Open((Table *)&old_fname,*(Options **)(file_number + 0x28),file,(uint64_t)handle,&table);
    _Var3 = old_fname._M_dataplus;
    this->env_ = (Env *)old_fname._M_dataplus._M_p;
    old_fname._M_dataplus._M_p = (pointer)0x0;
    Status::~Status((Status *)&old_fname);
    if (_Var3._M_p != (pointer)0x0) {
      if (table != (Table *)0x0) {
        __assert_fail("table == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/table_cache.cc"
                      ,0x40,
                      "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)")
        ;
      }
      goto LAB_0054b00f;
    }
    puVar5 = (undefined8 *)operator_new(0x10);
    *puVar5 = file;
    puVar5[1] = table;
    lVar4 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                      (*(long **)(file_number + 0x30),&key,puVar5,1,DeleteEntry);
    *in_R8 = lVar4;
  }
  else {
    SSTTableFileName(&old_fname,(string *)(file_number + 8),file_size);
    (**(code **)(**(long **)file_number + 0x18))(&local_a8,*(long **)file_number,&old_fname,&file);
    SVar2.state_ = local_a8.state_;
    Status::~Status(&local_a8);
    if (SVar2.state_ == (pointer)0x0) {
      this->env_ = (Env *)0x0;
      local_a8.state_ = _Var3._M_p;
      Status::~Status(&local_a8);
      std::__cxx11::string::~string((string *)&old_fname);
      goto LAB_0054afcd;
    }
    std::__cxx11::string::~string((string *)&old_fname);
LAB_0054b00f:
    if (file != (RandomAccessFile *)0x0) {
      (*file->_vptr_RandomAccessFile[1])();
    }
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_0054b064:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}